

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

dtime_t __thiscall
duckdb::Interpolator<false>::Extract<duckdb::dtime_t,duckdb::dtime_t>
          (Interpolator<false> *this,dtime_t *dest,Vector *result)

{
  dtime_t dVar1;
  dtime_t hi;
  dtime_t lo;
  dtime_t local_28;
  dtime_t local_20;
  
  if (this->CRN == this->FRN) {
    dVar1 = Cast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dest->micros);
    return (dtime_t)dVar1.micros;
  }
  local_20 = Cast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dest->micros);
  local_28 = Cast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dest[1].micros);
  dVar1 = CastInterpolation::Interpolate<duckdb::dtime_t>
                    (&local_20,
                     this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),&local_28);
  return (dtime_t)dVar1.micros;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}